

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall
tetgenmesh::memorypool::poolinit
          (memorypool *this,int bytecount,int itemcount,int wordsize,int alignment)

{
  void **ppvVar1;
  int alignment_local;
  int wordsize_local;
  int itemcount_local;
  int bytecount_local;
  memorypool *this_local;
  
  if (wordsize < alignment) {
    this->alignbytes = alignment;
  }
  else {
    this->alignbytes = wordsize;
  }
  if (this->alignbytes < 8) {
    this->alignbytes = 8;
  }
  this->itemwords =
       ((bytecount + this->alignbytes + -1) / this->alignbytes) * (this->alignbytes / wordsize);
  this->itembytes = this->itemwords * wordsize;
  this->itemsperblock = itemcount;
  ppvVar1 = (void **)malloc((long)(this->itemsperblock * this->itembytes) + 8 +
                            (long)this->alignbytes);
  this->firstblock = ppvVar1;
  if (this->firstblock == (void **)0x0) {
    terminatetetgen((tetgenmesh *)0x0,1);
  }
  *this->firstblock = (void *)0x0;
  restart(this);
  return;
}

Assistant:

void tetgenmesh::memorypool::poolinit(int bytecount,int itemcount,int wordsize,
                                      int alignment)
{
  // Find the proper alignment, which must be at least as large as:
  //   - The parameter `alignment'.
  //   - The primary word type, to avoid unaligned accesses.
  //   - sizeof(void *), so the stack of dead items can be maintained
  //       without unaligned accesses.
  if (alignment > wordsize) {
    alignbytes = alignment;
  } else {
    alignbytes = wordsize;
  }
  if ((int) sizeof(void *) > alignbytes) {
    alignbytes = (int) sizeof(void *);
  }
  itemwords = ((bytecount + alignbytes - 1) /  alignbytes)
            * (alignbytes / wordsize);
  itembytes = itemwords * wordsize;
  itemsperblock = itemcount;

  // Allocate a block of items.  Space for `itemsperblock' items and one
  //   pointer (to point to the next block) are allocated, as well as space
  //   to ensure alignment of the items. 
  firstblock = (void **) malloc(itemsperblock * itembytes + sizeof(void *)
                                + alignbytes); 
  if (firstblock == (void **) NULL) {
    terminatetetgen(NULL, 1);
  }
  // Set the next block pointer to NULL.
  *(firstblock) = (void *) NULL;
  restart();
}